

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O2

db_bit * __thiscall lan::db::read_container_bit(db *this,string *content,bool in_array)

{
  bool bVar1;
  db_bit *__rhs;
  db_bit *pdVar2;
  logic_error *this_00;
  undefined7 in_register_00000011;
  string sStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __rhs = (db_bit *)operator_new(0x50);
  (__rhs->key)._M_dataplus._M_p = (pointer)&(__rhs->key).field_2;
  (__rhs->key)._M_string_length = 0;
  (__rhs->key).field_2._M_local_buf[0] = '\0';
  __rhs->data = (void *)0x0;
  __rhs->pre = (db_bit *)0x0;
  __rhs->nex = (db_bit *)0x0;
  __rhs->lin = (db_bit *)0x0;
  __rhs->con = (db_bit *)0x0;
  if ((int)CONCAT71(in_register_00000011,in_array) == 0) {
    pop_next(&sStack_68,this,content);
    std::__cxx11::string::operator=((string *)__rhs,(string *)&sStack_68);
    std::__cxx11::string::~string((string *)&sStack_68);
  }
  __rhs->type = Container;
  pop_next(&sStack_68,this,content);
  bVar1 = std::operator==(&sStack_68,":");
  std::__cxx11::string::~string((string *)&sStack_68);
  if (bVar1) {
    pdVar2 = get_container_data(this,content);
    __rhs->lin = pdVar2;
    return __rhs;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_48,"LANDB (pull_error): unable read container <",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
  std::operator+(&sStack_68,&local_48,">, the param <:> was not found.");
  std::logic_error::logic_error(this_00,(string *)&sStack_68);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

lan::db_bit * db::read_container_bit(std::string & content, bool in_array){
            db_bit * bit = new db_bit;
            if(!in_array)
                bit->key = pop_next(content);
            bit->type = Container;
            if(pop_next(content) == ":") {
                bit->lin = get_container_data(content);
            } else {
                throw lan::errors::pull_error ("LANDB (pull_error): unable read container <" + bit->key + ">, the param <:> was not found.");
            } return bit;
        }